

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

Vec3fa __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::computeDirection(CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
                   *this,uint primID,size_t time)

{
  float fVar1;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  RefCount RVar6;
  long in_RCX;
  long lVar7;
  undefined4 in_register_00000034;
  Vec3fa *axis1;
  long lVar8;
  Vec3fa VVar9;
  
  lVar7 = *(long *)(CONCAT44(in_register_00000034,primID) + 0x188);
  iVar2 = *(int *)(*(long *)(CONCAT44(in_register_00000034,primID) + 0x58) +
                  (time & 0xffffffff) * *(long *)(CONCAT44(in_register_00000034,primID) + 0x68));
  lVar3 = *(long *)(lVar7 + in_RCX * 0x38);
  lVar7 = *(long *)(lVar7 + 0x10 + in_RCX * 0x38);
  lVar8 = (ulong)(iVar2 + 1) * lVar7;
  lVar7 = (ulong)(iVar2 + 2) * lVar7;
  fVar1 = *(float *)(CONCAT44(in_register_00000034,primID) + 0x24c);
  auVar4 = vinsertps_avx(*(undefined1 (*) [16])(lVar3 + lVar8),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar3 + 0xc + lVar8))),0x30);
  auVar5 = vinsertps_avx(*(undefined1 (*) [16])(lVar3 + lVar7),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar3 + 0xc + lVar7))),0x30);
  RVar6 = (RefCount)vsubps_avx(auVar5,auVar4);
  (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.super_Geometry.
  super_RefCount = RVar6;
  VVar9.field_0._0_8_ = RVar6._vptr_RefCount;
  VVar9.field_0._8_8_ = auVar5._0_8_;
  return (Vec3fa)VVar9.field_0;
}

Assistant:

Vec3fa computeDirection(unsigned int primID, size_t time) const
      {
        const Curve3ff c = getCurveScaledRadius(primID,time);
        const Vec3fa p0 = c.begin();
        const Vec3fa p3 = c.end();
        const Vec3fa axis1 = p3 - p0;
        return axis1;
      }